

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

Type * __thiscall
choc::value::Type::ComplexArray::getUniformType(Type *__return_storage_ptr__,ComplexArray *this)

{
  MainType MVar1;
  RepeatedGroup *pRVar2;
  ComplexArray *other;
  Object *other_00;
  undefined8 uVar3;
  Content *pCVar4;
  Object *this_00;
  
  if ((this->groups).size != 1) {
    throwError("This array does not contain a single element type");
  }
  pRVar2 = (this->groups).items;
  MVar1 = (pRVar2->elementType).mainType;
  pCVar4 = &(pRVar2->elementType).content;
  __return_storage_ptr__->mainType = MVar1;
  (__return_storage_ptr__->content).object = (Object *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  if (MVar1 == object) {
    other_00 = pCVar4->object;
    this_00 = (Object *)malloc(0x28);
    Object::Object(this_00,(Allocator *)0x0,other_00);
  }
  else {
    if (MVar1 != complexArray) {
      uVar3 = *(undefined8 *)((long)&(pRVar2->elementType).content + 8);
      (__return_storage_ptr__->content).object = pCVar4->object;
      *(undefined8 *)((long)&__return_storage_ptr__->content + 8) = uVar3;
      return __return_storage_ptr__;
    }
    other = pCVar4->complexArray;
    this_00 = (Object *)malloc(0x18);
    ComplexArray((ComplexArray *)this_00,(Allocator *)0x0,other);
  }
  (__return_storage_ptr__->content).complexArray = (ComplexArray *)this_00;
  return __return_storage_ptr__;
}

Assistant:

Type getUniformType() const
    {
        check (groups.size == 1, "This array does not contain a single element type");
        return groups.front().elementType;
    }